

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void srcarg_matrix_replicate(Context *ctx,int idx,int rows)

{
  SourceArgInfo *local_30;
  SourceArgInfo *dst;
  SourceArgInfo *src;
  int i;
  int rows_local;
  int idx_local;
  Context *ctx_local;
  
  local_30 = ctx->source_args + (idx + 1);
  for (src._4_4_ = 0; src._4_4_ < rows + -1; src._4_4_ = src._4_4_ + 1) {
    memcpy(local_30,ctx->source_args + idx,0x40);
    local_30->regnum = src._4_4_ + 1 + local_30->regnum;
    set_used_register(ctx,local_30->regtype,local_30->regnum,0);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

static void srcarg_matrix_replicate(Context *ctx, const int idx,
                                       const int rows)
{
    int i;
    SourceArgInfo *src = &ctx->source_args[idx];
    SourceArgInfo *dst = &ctx->source_args[idx+1];
    for (i = 0; i < (rows-1); i++, dst++)
    {
        memcpy(dst, src, sizeof (SourceArgInfo));
        dst->regnum += (i + 1);
        set_used_register(ctx, dst->regtype, dst->regnum, 0);
    } // for
}